

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerBailForDebugger(Lowerer *this,Instr *instr,bool isInsideHelper)

{
  Instr *pIVar1;
  code *pcVar2;
  RegNum reg;
  bool bVar3;
  BailOutKind BVar4;
  int iVar5;
  int32 iVar6;
  undefined4 extraout_var;
  LabelInstr *target;
  LabelInstr *target_00;
  BranchInstr *insertBeforeInstr;
  size_t sVar8;
  MemRefOpnd *pMVar9;
  IntConstOpnd *pIVar10;
  LabelInstr *pLVar11;
  JITTimeFunctionBody *pJVar12;
  intptr_t iVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RegOpnd *compareSrc1;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  StackSym *sym;
  SymOpnd *compareSrc1_00;
  undefined4 extraout_var_04;
  MemRefOpnd *src;
  Lowerer *dst;
  undefined4 *puVar14;
  Lowerer *pLVar15;
  byte bVar16;
  long lVar7;
  
  pIVar1 = instr->m_prev;
  BVar4 = IR::Instr::GetBailOutKind(instr);
  if (BVar4 == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3237,"(bailOutKind)","bailOutKind should not be zero at this time.");
    if (!bVar3) goto LAB_005bb6b4;
    *puVar14 = 0;
LAB_005bb07b:
    iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x26])();
    lVar7 = CONCAT44(extraout_var,iVar5);
    pLVar11 = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(instr,&pLVar11->super_Instr);
    target = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(instr,&target->super_Instr);
    target_00 = IR::LabelInstr::New(Label,this->m_func,isInsideHelper);
    IR::Instr::InsertAfter(instr,&target_00->super_Instr);
    insertBeforeInstr = InsertBranch(Br,false,target_00,&pLVar11->super_Instr);
    if ((~BVar4 & 0x8200000) == 0) {
      sVar8 = DebuggingFlags::GetForceInterpreterOffset();
      pMVar9 = IR::MemRefOpnd::New((void *)(lVar7 + sVar8),TyInt16,this->m_func,
                                   AddrOpndKindDynamicMisc);
      pLVar15 = (Lowerer *)0x0;
      pIVar10 = IR::IntConstOpnd::New(0,TyInt16,this->m_func,true);
      InsertCompareBranch(pLVar15,&pMVar9->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,false,target,
                          &insertBeforeInstr->super_Instr,false);
      BVar4 = BVar4 & ~(BailOutIgnoreException|BailOutExplicit|BailOutForceByFlag);
    }
    else {
      if ((BVar4 >> 0x15 & 1) != 0) {
        sVar8 = DebuggingFlags::GetForceInterpreterOffset();
        pMVar9 = IR::MemRefOpnd::New((void *)(sVar8 + lVar7),TyInt8,this->m_func,
                                     AddrOpndKindDynamicMisc);
        pLVar15 = (Lowerer *)0x0;
        pIVar10 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,true);
        InsertCompareBranch(pLVar15,&pMVar9->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,false,target,
                            &insertBeforeInstr->super_Instr,false);
        BVar4 = BVar4 & ~(BailOutExplicit|BailOutForceByFlag);
      }
      if ((BVar4 >> 0x1b & 1) != 0) {
        sVar8 = DebuggingFlags::GetByteCodeOffsetAfterIgnoreExceptionOffset();
        pMVar9 = IR::MemRefOpnd::New((void *)(lVar7 + sVar8),TyInt32,this->m_func,
                                     AddrOpndKindDynamicMisc);
        pLVar15 = (Lowerer *)&DAT_ffffffffffffffff;
        pIVar10 = IR::IntConstOpnd::New(-1,TyInt32,this->m_func,true);
        InsertCompareBranch(pLVar15,&pMVar9->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,false,target,
                            &insertBeforeInstr->super_Instr,false);
        BVar4 = BVar4 & ~(BailOutIgnoreException|BailOutExplicit);
      }
    }
    if ((BVar4 >> 0x16 & 1) != 0) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      iVar13 = JITTimeFunctionBody::GetProbeCountAddr(pJVar12);
      pMVar9 = IR::MemRefOpnd::New(iVar13,TyInt32,this->m_func,AddrOpndKindDynamicMisc);
      pLVar15 = (Lowerer *)0x0;
      pIVar10 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
      InsertCompareBranch(pLVar15,&pMVar9->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,false,target,
                          &insertBeforeInstr->super_Instr,false);
      BVar4 = BVar4 & ~BailOutBreakPointInFunction;
    }
    bVar16 = (byte)((BVar4 & BailOutStep) >> 0x1a);
    if ((BVar4 & BailOutStep) != BailOutInvalid) {
      iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x27])();
      pMVar9 = IR::MemRefOpnd::New(CONCAT44(extraout_var_00,iVar5),TyInt8,this->m_func,
                                   AddrOpndKindDynamicMisc);
      pIVar10 = IR::IntConstOpnd::New(3,TyInt8,this->m_func,true);
      InsertTest(&pMVar9->super_Opnd,&pIVar10->super_Opnd,&insertBeforeInstr->super_Instr);
      InsertBranch(BrNeq_A,false,target,&insertBeforeInstr->super_Instr);
      iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x27])();
      pMVar9 = IR::MemRefOpnd::New(CONCAT44(extraout_var_01,iVar5),TyInt8,this->m_func,
                                   AddrOpndKindDynamicMisc);
      pLVar15 = (Lowerer *)&DAT_00000008;
      pIVar10 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
      InsertCompareBranch(pLVar15,&pMVar9->super_Opnd,&pIVar10->super_Opnd,BrEq_A,true,pLVar11,
                          &insertBeforeInstr->super_Instr,false);
      BVar4 = BVar4 & ~BailOutStep;
    }
    if ((BVar4 >> 0x17 & 1) != 0) {
      reg = LowererMDArch::GetRegStackPointer();
      compareSrc1 = IR::RegOpnd::New((StackSym *)0x0,reg,TyInt64,this->m_func);
      iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x28])();
      pLVar15 = (Lowerer *)CONCAT44(extraout_var_02,iVar5);
      pMVar9 = IR::MemRefOpnd::New((intptr_t)pLVar15,TyInt64,this->m_func,AddrOpndKindDynamicMisc);
      InsertCompareBranch(pLVar15,&compareSrc1->super_Opnd,&pMVar9->super_Opnd,BrGt_A,true,target,
                          &insertBeforeInstr->super_Instr,false);
      iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x27])();
      pMVar9 = IR::MemRefOpnd::New(CONCAT44(extraout_var_03,iVar5),TyInt8,this->m_func,
                                   AddrOpndKindDynamicMisc);
      pLVar15 = (Lowerer *)&DAT_00000008;
      pIVar10 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
      InsertCompareBranch(pLVar15,&pMVar9->super_Opnd,&pIVar10->super_Opnd,BrEq_A,true,pLVar11,
                          &insertBeforeInstr->super_Instr,false);
      BVar4 = BVar4 & ~BailOutStackFrameBase;
      bVar16 = 1;
    }
    if ((BVar4 >> 0x18 & 1) != 0) {
      iVar6 = Func::GetHasLocalVarChangedOffset(this->m_func);
      if (iVar6 != -1) {
        sym = StackSym::New(TyInt8,this->m_func);
        sym->m_offset = iVar6;
        sym->field_0x19 = sym->field_0x19 | 0x10;
        compareSrc1_00 = IR::SymOpnd::New(&sym->super_Sym,TyInt8,this->m_func);
        pLVar15 = (Lowerer *)0x0;
        pIVar10 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
        InsertCompareBranch(pLVar15,&compareSrc1_00->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,false,
                            target,&insertBeforeInstr->super_Instr,false);
      }
      BVar4 = BVar4 & ~BailOutLocalValueChanged;
    }
    if (bVar16 != 0) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      iVar13 = JITTimeFunctionBody::GetScriptIdAddr(pJVar12);
      pMVar9 = IR::MemRefOpnd::New(iVar13,TyInt32,this->m_func,AddrOpndKindDynamicMisc);
      iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x29])();
      src = IR::MemRefOpnd::New(CONCAT44(extraout_var_04,iVar5),TyInt32,this->m_func,
                                AddrOpndKindDynamicMisc);
      dst = (Lowerer *)IR::RegOpnd::New(TyInt32,this->m_func);
      pLVar15 = dst;
      InsertMove((Opnd *)dst,&src->super_Opnd,&target->super_Instr,true);
      InsertCompareBranch(pLVar15,&pMVar9->super_Opnd,(Opnd *)dst,BrEq_A,true,target_00,
                          &target->super_Instr,false);
    }
    if (BVar4 == BailOutInvalid) {
      pLVar11 = (LabelInstr *)0x0;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x32d3,"(bailOutKind == (IR::BailOutKind)0)",
                         "Some of the bits in BailOutKind were not processed!");
      if (!bVar3) {
LAB_005bb6b4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar14 = 0;
      pLVar11 = (LabelInstr *)0x0;
    }
  }
  else {
    if (BVar4 == BailOutExplicit || (BVar4 >> 0x19 & 1) == 0) {
      if ((BVar4 >> 0x19 & 1) == 0) goto LAB_005bb07b;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3239,
                         "(!(bailOutKind & IR::BailOutExplicit) || bailOutKind == IR::BailOutExplicit)"
                         ,"BailOutExplicit cannot be combined with any other bailout flags.");
      if (!bVar3) goto LAB_005bb6b4;
      *puVar14 = 0;
    }
    pLVar11 = IR::LabelInstr::New(Label,this->m_func,false);
  }
  GenerateBailOut(this,instr,(BranchInstr *)0x0,pLVar11,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailForDebugger(IR::Instr* instr, bool isInsideHelper /* = false */)
{
    IR::Instr * prevInstr = instr->m_prev;

    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    AssertMsg(bailOutKind, "bailOutKind should not be zero at this time.");
    AssertMsg(!(bailOutKind & IR::BailOutExplicit) || bailOutKind == IR::BailOutExplicit,
        "BailOutExplicit cannot be combined with any other bailout flags.");

    IR::LabelInstr* explicitBailOutLabel = nullptr;

    if (!(bailOutKind & IR::BailOutExplicit))
    {
        intptr_t flags = m_func->GetScriptContextInfo()->GetDebuggingFlagsAddr();

        // Check 1 (do we need to bail out?)
        // JXX bailoutLabel
        // Check 2 (do we need to bail out?)
        // JXX bailoutLabel
        // ...
        // JMP continueLabel
        // bailoutDocumentLabel:
        // (determine if document boundary reached - if not, JMP to continueLabel)
        //  NOTE: THIS BLOCK IS CONDITIONALLY GENERATED BASED ON doGenerateBailOutDocumentBlock
        // bailoutLabel:
        // bail out
        // continueLabel:
        // ...

        IR::LabelInstr* bailOutDocumentLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, /*isOpHelper*/ true);
        instr->InsertBefore(bailOutDocumentLabel);
        IR::LabelInstr* bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, /*isOpHelper*/ true);
        instr->InsertBefore(bailOutLabel);
        IR::LabelInstr* continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, /*isOpHelper*/ isInsideHelper);
        instr->InsertAfter(continueLabel);
        IR::BranchInstr* continueBranchInstr = this->InsertBranch(Js::OpCode::Br, continueLabel, bailOutDocumentLabel);    // JMP continueLabel.

        bool doGenerateBailOutDocumentBlock = false;

        const IR::BailOutKind c_forceAndIgnoreEx = IR::BailOutForceByFlag | IR::BailOutIgnoreException;
        if ((bailOutKind & c_forceAndIgnoreEx) == c_forceAndIgnoreEx)
        {
            // It's faster to check these together in 1 check rather than 2 separate checks at run time.
            // CMP [&(flags->m_forceInterpreter, flags->m_isIgnoreException)], 0
            // BNE bailout
            IR::Opnd* opnd1 = IR::MemRefOpnd::New((BYTE*)flags + DebuggingFlags::GetForceInterpreterOffset(), TyInt16, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt16, m_func, /*dontEncode*/ true);
            InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
            bailOutKind ^= c_forceAndIgnoreEx;
        }
        else
        {
            if (bailOutKind & IR::BailOutForceByFlag)
            {
                // CMP [&flags->m_forceInterpreter], 0
                // BNE bailout
                IR::Opnd* opnd1 = IR::MemRefOpnd::New((BYTE*)flags + DebuggingFlags::GetForceInterpreterOffset(), TyInt8, m_func);
                IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt8, m_func, /*dontEncode*/ true);
                InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
                bailOutKind ^= IR::BailOutForceByFlag;
            }
            if (bailOutKind & IR::BailOutIgnoreException)
            {
                // CMP [&flags->m_byteCodeOffsetAfterIgnoreException], DebuggingFlags::InvalidByteCodeOffset
                // BNE bailout
                IR::Opnd* opnd1 = IR::MemRefOpnd::New((BYTE*)flags + DebuggingFlags::GetByteCodeOffsetAfterIgnoreExceptionOffset(), TyInt32, m_func);
                IR::Opnd* opnd2 = IR::IntConstOpnd::New(DebuggingFlags::InvalidByteCodeOffset, TyInt32, m_func, /*dontEncode*/ true);
                InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
                bailOutKind ^= IR::BailOutIgnoreException;
            }
        }

        if (bailOutKind & IR::BailOutBreakPointInFunction)
        {
            // CMP [&functionBody->m_sourceInfo.m_probeCount], 0
            // BNE bailout
            IR::Opnd* opnd1 = IR::MemRefOpnd::New(m_func->GetJITFunctionBody()->GetProbeCountAddr(), TyInt32, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt32, m_func, /*dontEncode*/ true);
            InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
            bailOutKind ^= IR::BailOutBreakPointInFunction;
        }

        // on method entry
        if(bailOutKind & IR::BailOutStep)
        {
            // TEST STEP_BAILOUT, [&stepController->StepType]
            // BNE BailoutLabel
            IR::Opnd* opnd1 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugStepTypeAddr(), TyInt8, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(Js::STEP_BAILOUT, TyInt8, this->m_func, /*dontEncode*/ true);
            InsertTestBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);

            // CMP  STEP_DOCUMENT, [&stepController->StepType]
            // BEQ BailoutDocumentLabel
            opnd1 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugStepTypeAddr(), TyInt8, m_func);
            opnd2 = IR::IntConstOpnd::New(Js::STEP_DOCUMENT, TyInt8, this->m_func, /*dontEncode*/ true);
            InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrEq_A, /*isUnsigned*/ true, bailOutDocumentLabel, continueBranchInstr);

            doGenerateBailOutDocumentBlock = true;

            bailOutKind ^= IR::BailOutStep;
        }

        // on method exit
        if (bailOutKind & IR::BailOutStackFrameBase)
        {
            // CMP EffectiveFrameBase, [&stepController->frameAddrWhenSet]
            // BA bailoutLabel
            RegNum effectiveFrameBaseReg;
#ifdef _M_X64
            effectiveFrameBaseReg = m_lowererMD.GetRegStackPointer();
#else
            effectiveFrameBaseReg = m_lowererMD.GetRegFramePointer();
#endif
            IR::Opnd* opnd1 = IR::RegOpnd::New(nullptr, effectiveFrameBaseReg, TyMachReg, m_func);
            IR::Opnd* opnd2 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugFrameAddressAddr(), TyMachReg, m_func);
            this->InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrGt_A, /*isUnsigned*/ true, bailOutLabel, continueBranchInstr);

            // CMP  STEP_DOCUMENT, [&stepController->StepType]
            // BEQ BailoutDocumentLabel
            opnd1 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugStepTypeAddr(), TyInt8, m_func);
            opnd2 = IR::IntConstOpnd::New(Js::STEP_DOCUMENT, TyInt8, this->m_func, /*dontEncode*/ true);
            InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrEq_A, /*isUnsigned*/ true, bailOutDocumentLabel, continueBranchInstr);

            doGenerateBailOutDocumentBlock = true;

            bailOutKind ^= IR::BailOutStackFrameBase;
        }

        if (bailOutKind & IR::BailOutLocalValueChanged)
        {
            int32 hasLocalVarChangedOffset = m_func->GetHasLocalVarChangedOffset();
            if (hasLocalVarChangedOffset != Js::Constants::InvalidOffset)
            {
                // CMP [EBP + hasLocalVarChangedStackOffset], 0
                // BNE bailout
                StackSym* sym = StackSym::New(TyInt8, m_func);
                sym->m_offset = hasLocalVarChangedOffset;
                sym->m_allocated = true;
                IR::Opnd* opnd1 = IR::SymOpnd::New(sym, TyInt8, m_func);
                IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt8, m_func);
                InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
            }
            bailOutKind ^= IR::BailOutLocalValueChanged;
        }

        if (doGenerateBailOutDocumentBlock)
        {
            // GENERATE the BailoutDocumentLabel
            // bailOutDocumentLabel:
            //   CMP CurrentScriptId, [&stepController->ScriptIdWhenSet]
            //   BEQ ContinueLabel
            // bailOutLabel:                // (fallthrough bailOutLabel)
            IR::Opnd* opnd1 = IR::MemRefOpnd::New(m_func->GetJITFunctionBody()->GetScriptIdAddr(), TyInt32, m_func);

            IR::Opnd* opnd2 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugScriptIdWhenSetAddr(), TyInt32, m_func);
            IR::RegOpnd* reg1 = IR::RegOpnd::New(TyInt32, m_func);
            InsertMove(reg1, opnd2, bailOutLabel);

            InsertCompareBranch(opnd1, reg1, Js::OpCode::BrEq_A, /*isUnsigned*/ true, continueLabel, bailOutLabel);
        }

        AssertMsg(bailOutKind == (IR::BailOutKind)0, "Some of the bits in BailOutKind were not processed!");

        // Note: at this time the 'instr' is in between bailoutLabel and continueLabel.
    }
    else
    {
        // For explicit/unconditional bailout use label which is not a helper, otherwise we would get a helper in main code path
        // which breaks helper label consistency (you can only get to helper from a conditional branch in main code), see DbCheckPostLower.
        explicitBailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
    }

    this->GenerateBailOut(instr, nullptr, explicitBailOutLabel);

    return prevInstr;
}